

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::AddObjectDepends
          (cmComputeTargetDepends *this,int depender_index,cmSourceFile *o,
          set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *emitted)

{
  cmGeneratorTarget *this_00;
  TargetType TVar1;
  ulong uVar2;
  reference ppcVar3;
  cmake *this_01;
  pair<std::_Rb_tree_const_iterator<cmLinkItem>,_bool> pVar4;
  undefined1 local_170 [24];
  string local_158;
  undefined8 local_138;
  undefined1 local_130 [16];
  undefined1 local_120;
  cmListFileBacktrace local_118 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_d8;
  cmLinkItem local_a8;
  value_type *local_68;
  cmLinkItem *objItem;
  cmGeneratorTarget *depender;
  _Rb_tree_node_base local_50;
  _Rb_tree_node_base *local_30;
  string *objLib;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *emitted_local;
  cmSourceFile *o_local;
  cmComputeTargetDepends *pcStack_10;
  int depender_index_local;
  cmComputeTargetDepends *this_local;
  
  objLib = (string *)emitted;
  emitted_local = (set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)o;
  o_local._4_4_ = depender_index;
  pcStack_10 = this;
  cmSourceFile::GetObjectLibrary_abi_cxx11_((string *)&local_50,o);
  local_30 = &local_50;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    depender._4_4_ = 1;
    goto LAB_0087719f;
  }
  ppcVar3 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
            operator[](&this->Targets,(long)o_local._4_4_);
  this_00 = *ppcVar3;
  objItem = (cmLinkItem *)this_00;
  std::__cxx11::string::string((string *)&local_f8,(string *)local_30);
  local_118[0].super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_118[0].super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmListFileBacktrace::cmListFileBacktrace(local_118);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            (&local_d8,&local_f8,local_118);
  cmGeneratorTarget::ResolveLinkItem(&local_a8,this_00,&local_d8);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
            (&local_d8);
  cmListFileBacktrace::~cmListFileBacktrace(local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  local_68 = &local_a8;
  pVar4 = std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                    ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)objLib,
                     local_68);
  local_138 = pVar4.first._M_node;
  local_130[0] = pVar4.second;
  local_130._8_8_ = local_138;
  local_120 = local_130[0];
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_0087718c:
    depender._4_4_ = 0;
  }
  else {
    TVar1 = cmGeneratorTarget::GetType((cmGeneratorTarget *)objItem);
    if (TVar1 == EXECUTABLE) {
LAB_00877174:
      cmTarget::AddUtility
                (*(cmTarget **)&objItem->String,(string *)local_30,false,(cmMakefile *)0x0);
      goto LAB_0087718c;
    }
    TVar1 = cmGeneratorTarget::GetType((cmGeneratorTarget *)objItem);
    if (TVar1 == STATIC_LIBRARY) goto LAB_00877174;
    TVar1 = cmGeneratorTarget::GetType((cmGeneratorTarget *)objItem);
    if (TVar1 == SHARED_LIBRARY) goto LAB_00877174;
    TVar1 = cmGeneratorTarget::GetType((cmGeneratorTarget *)objItem);
    if (TVar1 == MODULE_LIBRARY) goto LAB_00877174;
    TVar1 = cmGeneratorTarget::GetType((cmGeneratorTarget *)objItem);
    if (TVar1 == OBJECT_LIBRARY) goto LAB_00877174;
    this_01 = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"Only executables and libraries may reference target objects.",
               (allocator<char> *)(local_170 + 0x17));
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_170);
    cmake::IssueMessage(this_01,FATAL_ERROR,&local_158,(cmListFileBacktrace *)local_170);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_170);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator((allocator<char> *)(local_170 + 0x17));
    depender._4_4_ = 1;
  }
  cmLinkItem::~cmLinkItem(&local_a8);
LAB_0087719f:
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmComputeTargetDepends::AddObjectDepends(int depender_index,
                                              cmSourceFile const* o,
                                              std::set<cmLinkItem>& emitted)
{
  std::string const& objLib = o->GetObjectLibrary();
  if (objLib.empty()) {
    return;
  }
  cmGeneratorTarget const* depender = this->Targets[depender_index];
  cmLinkItem const& objItem =
    depender->ResolveLinkItem(BT<std::string>(objLib));
  if (emitted.insert(objItem).second) {
    if (depender->GetType() != cmStateEnums::EXECUTABLE &&
        depender->GetType() != cmStateEnums::STATIC_LIBRARY &&
        depender->GetType() != cmStateEnums::SHARED_LIBRARY &&
        depender->GetType() != cmStateEnums::MODULE_LIBRARY &&
        depender->GetType() != cmStateEnums::OBJECT_LIBRARY) {
      this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR,
        "Only executables and libraries may reference target objects.",
        depender->GetBacktrace());
      return;
    }
    const_cast<cmGeneratorTarget*>(depender)->Target->AddUtility(objLib,
                                                                 false);
  }
}